

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flstring.c
# Opt level: O1

int fl_ascii_strcasecmp(char *s,char *t)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char cVar4;
  char *pcVar5;
  int iVar6;
  
  if (t == (char *)0x0 || s == (char *)0x0) {
    uVar3 = -(uint)(s == (char *)0x0) | 1;
    if (s == t) {
      uVar3 = 0;
    }
    return uVar3;
  }
  cVar4 = *s;
  if (cVar4 != '\0') {
    pcVar5 = s + 1;
    do {
      cVar1 = *t;
      if (cVar1 == '\0') break;
      if (cVar4 != cVar1) {
        if (cVar4 < cVar1) {
          iVar2 = -1;
          if (0x19 < (byte)(cVar4 + 0xbfU)) {
            return -1;
          }
          iVar6 = cVar4 + 0x20;
        }
        else {
          iVar2 = 1;
          if (0x19 < (byte)(cVar4 + 0x9fU)) {
            return 1;
          }
          iVar6 = cVar4 + -0x20;
        }
        if (iVar6 != cVar1) {
          return iVar2;
        }
      }
      t = t + 1;
      cVar4 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar4 != '\0');
  }
  uVar3 = -(uint)(*t != '\0') | 1;
  if (cVar4 == *t) {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

int fl_ascii_strcasecmp(const char *s, const char *t) {
  if (!s || !t) return (s==t ? 0 : (!s ? -1 : +1));
  
  for(;*s && *t; s++,t++) {
    if (*s == *t) continue;
    if (*s < *t) {
      if ( (*s+0x20)!=*t || !C_RANGE(*s,'A','Z') ) return -1;
    } else { 	/* (*s > *t) */
      if ( (*s-0x20)!=*t || !C_RANGE(*s,'a','z') ) return +1;
    }
  }
  return (*s==*t) ? 0 : (*t ? -1 : +1);
}